

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O1

void jpeg_idct_16x8(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                   JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int aiStack_138 [66];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  uVar17 = 9;
  lVar23 = 0;
  do {
    lVar27 = (long)*(short *)((long)coef_block + lVar23 + 0x10);
    if ((((lVar27 == 0) && (*(short *)((long)coef_block + lVar23 + 0x20) == 0)) &&
        (*(short *)((long)coef_block + lVar23 + 0x30) == 0)) &&
       (((*(short *)((long)coef_block + lVar23 + 0x40) == 0 &&
         (*(short *)((long)coef_block + lVar23 + 0x50) == 0)) &&
        ((*(short *)((long)coef_block + lVar23 + 0x60) == 0 &&
         (*(short *)((long)coef_block + lVar23 + 0x70) == 0)))))) {
      iVar5 = (int)*(short *)((long)coef_block + lVar23) * *(int *)((long)pvVar4 + lVar23 * 2) * 4;
      *(int *)((long)aiStack_138 + lVar23 * 2) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x20) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x40) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x60) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x80) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0xa0) = iVar5;
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0xc0) = iVar5;
      lVar27 = 0xe0;
    }
    else {
      lVar9 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0x40) *
              (long)*(short *)((long)coef_block + lVar23 + 0x20);
      lVar30 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0xc0) *
               (long)*(short *)((long)coef_block + lVar23 + 0x60);
      lVar7 = (lVar30 + lVar9) * 0x1151;
      lVar38 = lVar9 * 0x187e + lVar7;
      lVar7 = lVar30 * -0x3b21 + lVar7;
      lVar9 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0x80) *
              (long)*(short *)((long)coef_block + lVar23 + 0x40);
      uVar10 = (long)*(int *)((long)pvVar4 + lVar23 * 2) *
               (long)*(short *)((long)coef_block + lVar23) * 0x2000;
      lVar8 = lVar9 * 0x2000 + uVar10 + 0x400;
      lVar11 = (uVar10 | 0x400) + lVar9 * -0x2000;
      lVar9 = lVar8 + lVar38;
      lVar8 = lVar8 - lVar38;
      lVar30 = lVar11 + lVar7;
      lVar11 = lVar11 - lVar7;
      lVar32 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0xe0) *
               (long)*(short *)((long)coef_block + lVar23 + 0x70);
      lVar39 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0xa0) *
               (long)*(short *)((long)coef_block + lVar23 + 0x50);
      lVar40 = (long)*(int *)((long)pvVar4 + lVar23 * 2 + 0x60) *
               (long)*(short *)((long)coef_block + lVar23 + 0x30);
      lVar27 = *(int *)((long)pvVar4 + lVar23 * 2 + 0x20) * lVar27;
      lVar7 = (lVar40 + lVar32 + lVar39 + lVar27) * 0x25a1;
      lVar22 = (lVar40 + lVar32) * -0x3ec5 + lVar7;
      lVar7 = (lVar39 + lVar27) * -0xc7c + lVar7;
      lVar38 = (lVar32 + lVar27) * -0x1ccd;
      lVar32 = lVar32 * 0x98e + lVar38 + lVar22;
      lVar38 = lVar27 * 0x300b + lVar38 + lVar7;
      lVar27 = (lVar40 + lVar39) * -0x5203;
      lVar7 = lVar39 * 0x41b3 + lVar27 + lVar7;
      lVar22 = lVar40 * 0x6254 + lVar27 + lVar22;
      *(int *)((long)aiStack_138 + lVar23 * 2) = (int)((ulong)(lVar38 + lVar9) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0xe0) = (int)((ulong)(lVar9 - lVar38) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x20) = (int)((ulong)(lVar22 + lVar30) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0xc0) = (int)((ulong)(lVar30 - lVar22) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x40) = (int)((ulong)(lVar7 + lVar11) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0xa0) = (int)((ulong)(lVar11 - lVar7) >> 0xb);
      *(int *)((long)aiStack_138 + lVar23 * 2 + 0x60) = (int)((ulong)(lVar32 + lVar8) >> 0xb);
      iVar5 = (int)((ulong)(lVar8 - lVar32) >> 0xb);
      lVar27 = 0x80;
    }
    *(int *)((long)aiStack_138 + lVar23 * 2 + lVar27) = iVar5;
    uVar17 = uVar17 - 1;
    lVar23 = lVar23 + 2;
  } while (1 < uVar17);
  uVar10 = (ulong)output_col;
  lVar23 = 0;
  do {
    iVar6 = aiStack_138[lVar23 + 1];
    iVar24 = aiStack_138[lVar23] * 0x2000;
    iVar5 = aiStack_138[lVar23 + 4];
    iVar14 = iVar24 + iVar5 * 0x29cf + 0x20000;
    iVar34 = iVar24 + iVar5 * 0x1151 + 0x20000;
    iVar1 = aiStack_138[lVar23 + 2];
    iVar2 = aiStack_138[lVar23 + 6];
    iVar33 = iVar24 + 0x20000 + iVar5 * -0x1151;
    iVar16 = (iVar1 - iVar2) * 0x8d4;
    iVar19 = (iVar1 - iVar2) * 0x2c63;
    iVar28 = iVar2 * 0x5203 + iVar19;
    iVar12 = iVar1 * 0x1ccd + iVar16;
    iVar19 = iVar1 * -0x133e + iVar19;
    iVar25 = iVar24 + 0x20000 + iVar5 * -0x29cf;
    iVar16 = iVar2 * -0x1050 + iVar16;
    iVar5 = iVar28 + iVar14;
    iVar24 = aiStack_138[lVar23 + 3];
    iVar14 = iVar14 - iVar28;
    iVar28 = aiStack_138[lVar23 + 5];
    iVar18 = aiStack_138[lVar23 + 7];
    iVar1 = iVar12 + iVar34;
    iVar35 = (iVar24 + iVar6) * 0x2b4e;
    iVar15 = (iVar18 + iVar6) * 0x22fc;
    iVar34 = iVar34 - iVar12;
    iVar26 = (iVar28 + iVar6) * 0x27e9;
    iVar31 = iVar6 * -0x492a + iVar35 + iVar26 + iVar15;
    iVar2 = iVar19 + iVar33;
    iVar33 = iVar33 - iVar19;
    iVar29 = (iVar6 - iVar18) * 0x1cb6;
    iVar19 = (iVar28 + iVar6) * 0x1555;
    iVar20 = (iVar6 - iVar24) * 0xd23;
    iVar13 = iVar6 * -0x3abe + iVar20 + iVar19 + iVar29;
    iVar36 = (iVar28 + iVar24) * 0x470;
    iVar6 = (iVar24 + iVar18) * -0x1555;
    iVar37 = iVar36 + iVar6 + iVar24 * 0x24d + iVar35;
    iVar21 = (iVar28 - iVar24) * 0x2d09;
    iVar12 = (iVar24 + iVar18) * -0x27e9;
    iVar35 = (iVar18 + iVar28) * -0x2b4e;
    iVar26 = iVar26 + iVar35 + iVar28 * -0x2406 + iVar36;
    iVar20 = iVar21 + iVar12 + iVar24 * 0x3f1a + iVar20;
    iVar24 = iVar15 + iVar35 + iVar18 * 0x2218 + iVar6;
    iVar6 = (iVar18 - iVar28) * 0xd23;
    iVar12 = iVar29 + iVar6 + iVar18 * 0x6485 + iVar12;
    iVar18 = iVar16 + iVar25;
    iVar25 = iVar25 - iVar16;
    iVar6 = iVar19 + iVar6 + iVar28 * -0x1886 + iVar21;
    lVar27 = *(long *)((long)output_buf + lVar23);
    *(JSAMPLE *)(lVar27 + uVar10) = pJVar3[(ulong)((uint)(iVar31 + iVar5) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 0xf + uVar10) =
         pJVar3[(ulong)((uint)(iVar5 - iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 1 + uVar10) =
         pJVar3[(ulong)((uint)(iVar37 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 0xe + uVar10) =
         pJVar3[(ulong)((uint)(iVar1 - iVar37) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 2 + uVar10) =
         pJVar3[(ulong)((uint)(iVar26 + iVar2) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 0xd + uVar10) =
         pJVar3[(ulong)((uint)(iVar2 - iVar26) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 3 + uVar10) =
         pJVar3[(ulong)((uint)(iVar18 + iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 0xc + uVar10) =
         pJVar3[(ulong)((uint)(iVar18 - iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 4 + uVar10) =
         pJVar3[(ulong)((uint)(iVar12 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 0xb + uVar10) =
         pJVar3[(ulong)((uint)(iVar25 - iVar12) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 5 + uVar10) =
         pJVar3[(ulong)((uint)(iVar6 + iVar33) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 10 + uVar10) =
         pJVar3[(ulong)((uint)(iVar33 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 6 + uVar10) =
         pJVar3[(ulong)((uint)(iVar20 + iVar34) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 9 + uVar10) =
         pJVar3[(ulong)((uint)(iVar34 - iVar20) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 7 + uVar10) =
         pJVar3[(ulong)((uint)(iVar13 + iVar14) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar27 + 8 + uVar10) =
         pJVar3[(ulong)((uint)(iVar14 - iVar13) >> 0x12 & 0x3ff) + 0x80];
    lVar23 = lVar23 + 8;
  } while (lVar23 != 0x40);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_16x8 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		JCOEFPTR coef_block,
		JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*8];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;
      
      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);
    
    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;
    
    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */
    
    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;
    
    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */
    
    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process 8 rows from work array, store into output array.
   * 16-point IDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;

    z1 = (INT32) wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (INT32) wsptr[2];
    z2 = (INT32) wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    z4 = (INT32) wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
	    MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
	    MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, - FIX(0.666655658));      /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, - FIX(1.247225013));      /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, - FIX(1.353318001)); /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int) RIGHT_SHIFT(tmp20 + tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[15] = range_limit[(int) RIGHT_SHIFT(tmp20 - tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[1]  = range_limit[(int) RIGHT_SHIFT(tmp21 + tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[14] = range_limit[(int) RIGHT_SHIFT(tmp21 - tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[2]  = range_limit[(int) RIGHT_SHIFT(tmp22 + tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[13] = range_limit[(int) RIGHT_SHIFT(tmp22 - tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[3]  = range_limit[(int) RIGHT_SHIFT(tmp23 + tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[12] = range_limit[(int) RIGHT_SHIFT(tmp23 - tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[4]  = range_limit[(int) RIGHT_SHIFT(tmp24 + tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[11] = range_limit[(int) RIGHT_SHIFT(tmp24 - tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[5]  = range_limit[(int) RIGHT_SHIFT(tmp25 + tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[10] = range_limit[(int) RIGHT_SHIFT(tmp25 - tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[6]  = range_limit[(int) RIGHT_SHIFT(tmp26 + tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[9]  = range_limit[(int) RIGHT_SHIFT(tmp26 - tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[7]  = range_limit[(int) RIGHT_SHIFT(tmp27 + tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[8]  = range_limit[(int) RIGHT_SHIFT(tmp27 - tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}